

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

int tokgetlin(tokcxdef *ctx,int dopound)

{
  ushort *puVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  lindef *plVar5;
  int iVar6;
  int iVar7;
  uchar *__dest;
  lindef *plVar8;
  ushort **ppuVar9;
  size_t __n;
  uint uVar10;
  size_t siz;
  uchar *__dest_00;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  
LAB_00116b7a:
  while( true ) {
    iVar6 = (*ctx->tokcxlin->lingetp)(ctx->tokcxlin);
    plVar8 = ctx->tokcxlin;
    if (iVar6 == 0) break;
    plVar5 = plVar8->linpar;
    if (plVar5 == (lindef *)0x0) {
      if (ctx->tokcxifcnt == 0) {
        return 1;
      }
      errlogf(ctx->tokcxerr,"TADS",0x77);
      return 1;
    }
    (*plVar8->linclsp)(plVar8);
    if (ctx->tokcxdbg == (dbgcxdef *)0x0) {
      free(ctx->tokcxlin);
    }
    ctx->tokcxlin = plVar5;
    if ((plVar5->linflg & 0x10) == 0) {
      ctx->tokcxflg = ctx->tokcxflg & 0xfffffffb;
    }
    else {
      ctx->tokcxflg = ctx->tokcxflg | 4;
    }
  }
  if ((plVar8->linflg & 2) == 0) {
    pcVar16 = plVar8->linbuf;
    ctx->tokcxptr = pcVar16;
    ctx->tokcxlen = plVar8->linlen;
  }
  else {
    __dest_00 = (uchar *)ctx->tokcxbuf;
    if (__dest_00 == (uchar *)0x0) {
      __dest_00 = mchalo(ctx->tokcxerr,0x400,"tok");
      ctx->tokcxbuf = (char *)__dest_00;
      ctx->tokcxbsz = 0x400;
      uVar14 = 0x400;
    }
    else {
      uVar14 = (uint)ctx->tokcxbsz;
    }
    ctx->tokcxlen = 0;
    do {
      plVar8 = ctx->tokcxlin;
      uVar4 = plVar8->linlen;
      ctx->tokcxlen = ctx->tokcxlen + uVar4;
      uVar3 = plVar8->linflg;
      if (uVar14 <= uVar4) {
        if (0x8000 < (ulong)ctx->tokcxbsz) {
          errsigf(ctx->tokcxerr,"TADS",0x6e);
        }
        uVar14 = uVar14 + 0x1000;
        siz = (ulong)ctx->tokcxbsz + 0x1000;
        ctx->tokcxbsz = (ushort)siz;
        __dest = mchalo(ctx->tokcxerr,siz,"tok");
        memcpy(__dest,ctx->tokcxbuf,(long)__dest_00 - (long)ctx->tokcxbuf);
        __dest_00 = __dest + ((long)__dest_00 - (long)ctx->tokcxbuf);
        free(ctx->tokcxbuf);
        ctx->tokcxbuf = (char *)__dest;
        plVar8 = ctx->tokcxlin;
      }
      memcpy(__dest_00,plVar8->linbuf,(ulong)uVar4);
      __dest_00 = __dest_00 + uVar4;
      if ((uVar3 & 2) == 0) break;
      uVar14 = uVar14 - uVar4;
      iVar6 = (*ctx->tokcxlin->lingetp)(ctx->tokcxlin);
    } while (iVar6 == 0);
    *__dest_00 = '\0';
    pcVar16 = ctx->tokcxbuf;
    ctx->tokcxptr = pcVar16;
  }
  if (dopound != 0) {
    uVar4 = ctx->tokcxlen;
    if (((uVar4 != 0) && (*pcVar16 == '#')) && ((ctx->tokcxlin->linflg & 8) == 0)) {
      uVar13 = 0;
      pcVar11 = pcVar16;
      do {
        uVar15 = uVar13;
        iVar6 = (int)uVar15;
        pcVar12 = pcVar16 + (ulong)(uVar4 - 1) + 1;
        if (uVar4 - 1 == iVar6) break;
        cVar2 = pcVar16[uVar15 + 1];
        if ((long)cVar2 < 0) {
          pcVar12 = pcVar16 + uVar15 + 1;
          break;
        }
        pcVar12 = pcVar11 + 1;
        ppuVar9 = __ctype_b_loc();
        uVar13 = uVar15 + 1;
        pcVar11 = pcVar12;
      } while ((*(byte *)((long)*ppuVar9 + (long)cVar2 * 2 + 1) & 0x20) != 0);
      lVar17 = 0;
      do {
        uVar14 = *(uint *)((long)&tokgetlin::dir[0].len + lVar17);
        if ((int)uVar14 < (int)((uint)uVar4 - iVar6)) {
          __n = (size_t)(int)uVar14;
          iVar7 = bcmp(pcVar12,*(void **)((long)&tokgetlin::dir[0].nm + lVar17),__n);
          if ((iVar7 == 0) &&
             ((uVar10 = ((uint)uVar4 - iVar6) - 1, (uVar4 - uVar14) + -1 == iVar6 ||
              ((cVar2 = pcVar12[__n], -1 < (long)cVar2 &&
               (ppuVar9 = __ctype_b_loc(), uVar10 = uVar14,
               (*(byte *)((long)*ppuVar9 + (long)cVar2 * 2 + 1) & 0x20) != 0)))))) {
            tokgetlin::dirp = (anon_struct_24_4_067c1e49 *)((long)&tokgetlin::dir[0].nm + lVar17);
            if ((*(int *)((long)&tokgetlin::dir[0].ok_in_if + lVar17) == 0) &&
               ((ctx->tokcxifcnt != 0 && ((ctx->tokcxifcur & 0xfffffffdU) != 1))))
            goto LAB_00116b7a;
            pcVar12 = pcVar12 + __n;
            uVar13 = 0;
            if (~uVar10 + (uint)uVar4 == iVar6) goto LAB_00116eef;
            uVar15 = ~uVar15 + (ulong)-uVar10 + (ulong)uVar4;
            goto LAB_00116ec9;
          }
        }
        lVar17 = lVar17 + 0x18;
      } while ((int)lVar17 != 0x108);
      errlogf(ctx->tokcxerr,"TADS",0x68);
      goto LAB_00116b7a;
    }
  }
  if ((ctx->tokcxifcnt == 0) || ((ctx->tokcxifcur != 2 && (ctx->tokcxifcur != 4)))) {
    puVar1 = &ctx->tokcxlin->linflg;
    *puVar1 = *puVar1 & 0xfffb;
    return 0;
  }
  goto LAB_00116b7a;
  while( true ) {
    pcVar12 = pcVar12 + 1;
    uVar14 = (int)uVar15 - 1;
    uVar15 = (ulong)uVar14;
    if (uVar14 == 0) break;
LAB_00116ec9:
    cVar2 = *pcVar12;
    if (((long)cVar2 < 0) ||
       (ppuVar9 = __ctype_b_loc(), (*(byte *)((long)*ppuVar9 + (long)cVar2 * 2 + 1) & 0x20) == 0)) {
      uVar13 = uVar15 & 0xffffffff;
      break;
    }
  }
LAB_00116eef:
  (**(code **)((long)&tokgetlin::dir[0].fn + lVar17))(ctx,pcVar12,uVar13);
  goto LAB_00116b7a;
}

Assistant:

static int tokgetlin(tokcxdef *ctx, int dopound)
{
    for (;;)
    {
        if (linget(ctx->tokcxlin))
        {
            /* at eof in current source; resume parent if there is one */
            if (ctx->tokcxlin->linpar)
            {
                lindef *parent;
                
                parent = ctx->tokcxlin->linpar;          /* remember parent */
                lincls(ctx->tokcxlin);               /* close included file */
                if (!ctx->tokcxdbg)               /* if no debug context... */
                    mchfre(ctx->tokcxlin);              /* free line source */
                ctx->tokcxlin = parent;      /* reset to parent line source */
                if (parent->linflg & LINFCMODE)
                    ctx->tokcxflg |= TOKCXFCMODE;
                else
                    ctx->tokcxflg &= ~TOKCXFCMODE;
                continue;                       /* back for another attempt */
            }
            else
            {
                /* check for outstanding #if/#ifdef */
                if (ctx->tokcxifcnt)
                    errlog(ctx->tokcxerr, ERR_NOENDIF);

                /* return end-of-file indication */
                return TRUE;
            }
        }
        
        /* if this is a multi-segment line, copy it into our own buffer */
        if (ctx->tokcxlin->linflg & LINFMORE)
        {
            char *p;
            uint  rem;
            int   done;
            
            if (!ctx->tokcxbuf)
            {
                /* allocate 1k as a default buffer */
                ctx->tokcxbuf = (char *)mchalo(ctx->tokcxerr, 1024,
                                               "tok");
                ctx->tokcxbsz = 1024;
            }
            ctx->tokcxlen = 0;
            
            for (done = FALSE, p = ctx->tokcxbuf, rem = ctx->tokcxbsz ;
                 !done ; )
            {
                size_t len = ctx->tokcxlin->linlen;

                /* add the current segment's length into line length */
                ctx->tokcxlen += len;
                
                /* we're done after this piece if the last fetch was all */
                done = !(ctx->tokcxlin->linflg & LINFMORE);
                if (len + 1 > rem)
                {
                    char *newp;

                    /* increase the size of the buffer */
                    if (ctx->tokcxbsz > (unsigned)0x8000)
                        errsig(ctx->tokcxerr, ERR_LONGLIN);
                    rem += 4096;
                    ctx->tokcxbsz += 4096;
                    
                    /* allocate a new buffer and copy line into it */
                    newp = (char *)mchalo(ctx->tokcxerr, ctx->tokcxbsz, "tok");
                    memcpy(newp, ctx->tokcxbuf, (size_t)(p - ctx->tokcxbuf));
                    
                    /* free the original buffer, and use the new one */
                    p = (p - ctx->tokcxbuf) + newp;
                    mchfre(ctx->tokcxbuf);
                    ctx->tokcxbuf = newp;
                }
                
                /* add the line to the buffer */
                memcpy(p, ctx->tokcxlin->linbuf, len);
                p += len;
                rem -= len;
                
                /* get the next piece of the line if there is one */
                if (!done)
                {
                    if (linget(ctx->tokcxlin)) break;
                }
            }
            
            /* null-terminate the buffer, and use it for input */
            *p = '\0';
            ctx->tokcxptr = ctx->tokcxbuf;
        }
        else
        {
            ctx->tokcxptr = ctx->tokcxlin->linbuf;
            ctx->tokcxlen = ctx->tokcxlin->linlen;
        }
        
        /* check for preprocessor directives */
        if (dopound && ctx->tokcxlen != 0 && ctx->tokcxptr[0] == '#'
            && !(ctx->tokcxlin->linflg & LINFNOINC))
        {
            char   *p;
            int     len;
            static  struct
            {
                char  *nm;
                int    len;
                int    ok_in_if;
                void (*fn)(tokcxdef *, char *, int);
            }
            *dirp, dir[] =
            {
                { "include", 7, FALSE, tokinclude },
                { "pragma",  6, FALSE, tokpragma },
                { "define",  6, FALSE, tokdefine },
                { "ifdef",   5, TRUE, tokifdef },
                { "ifndef",  6, TRUE, tokifndef },
                { "if",      2, TRUE, tokif },
                { "else",    4, TRUE, tokelse },
                { "elif",    4, TRUE, tokelif },
                { "endif",   5, TRUE, tokendif },
                { "undef",   5, FALSE, tokundef },
                { "error",   5, FALSE, tok_p_error }
            };
            int  i;

            /* scan off spaces between '#' and directive */
            for (len = ctx->tokcxlen - 1, p = &ctx->tokcxptr[1] ;
                 len && t_isspace(*p) ; --len, ++p) ;

            /* find and process the directive */
            for (dirp = dir, i = sizeof(dir)/sizeof(dir[0]) ; i ; --i, ++dirp)
            {
                /* compare this directive; if it wins, call its function */
                if (len >= dirp->len && !memcmp(p, dirp->nm, (size_t)dirp->len)
                    && (len == dirp->len || t_isspace(*(p + dirp->len))))
                {
                    int cnt;
                    int stat;
                    
                    /*
                     *   if we're not in a #if's false part, or if the
                     *   directive is processed even in #if false parts,
                     *   process the line, otherwise skip it 
                     */
                    cnt = ctx->tokcxifcnt;
                    if (dirp->ok_in_if || cnt == 0
                        || ((stat = ctx->tokcxifcur) == TOKIF_IF_YES
                            || stat == TOKIF_ELSE_YES))
                    {
                        /* skip whitespace following the directive */
                        for (p += dirp->len, len -= dirp->len ;
                             len && t_isspace(*p) ;
                             --len, ++p) ;

                        /* invoke the function to process this directive */
                        (*dirp->fn)(ctx, p, len);
                    }

                    /* there's no need to look at more directives */
                    break;
                }
            }

            /* if we didn't find anything, flag the error */
            if (i == 0)
                errlog(ctx->tokcxerr, ERR_PRPDIR);

            /* ignore this line */
            continue;
        }
        else
        {
            /*
             *   Check the #if level.  If we're in an #if, and we're to
             *   ignore lines (because of a false condition or an #else
             *   part for a true condition), skip this line. 
             */
            if (ctx->tokcxifcnt != 0)
            {
                switch(ctx->tokcxifcur)
                {
                case TOKIF_IF_NO:
                case TOKIF_ELSE_NO:
                    /* ignore this line */
                    continue;

                default:
                    /* we're in a true part - keep the line */
                    break;
                }
            }
            
            ctx->tokcxlin->linflg &= ~LINFDBG;       /* no debug record yet */
            return(FALSE);                      /* return the line we found */
        }
    }
}